

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O3

void __thiscall pg::FPISolver::runSeq(FPISolver *this)

{
  bitset *this_00;
  uint64_t *puVar1;
  char cVar2;
  bitset *pbVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  Game *pGVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  ulong uVar20;
  _label_vertex local_50;
  ulong local_40;
  bitset *local_38;
  
  local_38 = &this->distraction;
  bitset::resize(local_38,((this->super_Solver).game)->n_vertices);
  pGVar7 = (this->super_Solver).game;
  uVar14 = pGVar7->n_vertices;
  uVar20 = -(ulong)(uVar14 >> 0x3e != 0) | uVar14 * 4;
  local_40 = uVar14;
  piVar4 = (int *)operator_new__(uVar20);
  this->strategy = piVar4;
  piVar4 = (int *)operator_new__(uVar20);
  this->frozen = piVar4;
  iVar11 = 0;
  memset(piVar4,0,uVar14 * 4);
  iVar9 = *(int *)((long)pGVar7->_priority + ((long)((uVar14 << 0x20) + -0x100000000) >> 0x1e));
  uVar14 = 0xffffffffffffffff;
  if (-2 < iVar9) {
    uVar14 = (long)(int)(iVar9 + 1U) << 2;
  }
  pvVar5 = operator_new__(uVar14);
  pvVar6 = operator_new__(uVar14);
  this_00 = &this->parity;
  bitset::resize(this_00,local_40);
  if (iVar9 < 0) {
    this->iterations = 1;
  }
  else {
    pGVar7 = (this->super_Solver).game;
    uVar14 = 0;
    piVar4 = pGVar7->_priority;
    do {
      uVar20 = (ulong)iVar11;
      if (uVar14 == (uint)piVar4[uVar20]) {
        *(int *)((long)pvVar5 + uVar14 * 4) = iVar11;
        iVar16 = iVar11;
        if ((long)uVar20 < pGVar7->n_vertices) {
          puVar1 = this_00->_bits;
          do {
            if (uVar14 != (uint)piVar4[uVar20]) break;
            uVar17 = uVar20 >> 6;
            uVar18 = 1L << (uVar20 & 0x3f);
            if ((uVar14 & 1) == 0) {
              uVar19 = ~uVar18 & puVar1[uVar17];
            }
            else {
              uVar19 = uVar18 | puVar1[uVar17];
            }
            puVar1[uVar17] = uVar19;
            uVar20 = uVar20 + 1;
          } while ((long)uVar20 < pGVar7->n_vertices);
          iVar16 = (int)uVar20;
        }
        iVar15 = iVar16 - iVar11;
        iVar11 = iVar16;
      }
      else {
        iVar15 = 0;
        *(undefined4 *)((long)pvVar5 + uVar14 * 4) = 0xffffffff;
      }
      *(int *)((long)pvVar6 + uVar14 * 4) = iVar15;
      uVar14 = uVar14 + 1;
    } while (uVar14 != iVar9 + 1U);
    this->iterations = 1;
    if (-1 < iVar9) {
      iVar11 = 0;
      do {
        iVar15 = *(int *)((long)pvVar6 + (long)iVar11 * 4);
        if (iVar15 == 0) {
LAB_001616cf:
          iVar11 = iVar11 + 1;
        }
        else {
          iVar16 = *(int *)((long)pvVar5 + (long)iVar11 * 4);
          iVar15 = updateBlock(this,iVar16,iVar15);
          if (iVar15 == 0) goto LAB_001616cf;
          if (iVar11 != 0) {
            freezeThawReset(this,0,iVar16,iVar11);
          }
          this->iterations = this->iterations + 1;
          iVar11 = 0;
          if (1 < (this->super_Solver).trace) {
            poVar8 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"restarting after finding distractions",0x25);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
        }
      } while (iVar11 <= iVar9);
    }
  }
  pbVar3 = local_38;
  pGVar7 = (this->super_Solver).game;
  lVar10 = pGVar7->n_vertices;
  if (0 < lVar10) {
    uVar14 = 0;
    do {
      uVar20 = uVar14 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar20] >> (uVar14 & 0x3f) & 1) == 0) {
        uVar17 = 1L << (uVar14 & 0x3f);
        bVar12 = ((pbVar3->_bits[uVar20] & uVar17) != 0) != ((this_00->_bits[uVar20] & uVar17) != 0)
        ;
        iVar9 = -1;
        if (bVar12 != (((pGVar7->_owner)._bits[uVar20] & uVar17) == 0)) {
          iVar9 = this->strategy[uVar14];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar14,(uint)bVar12,iVar9);
        pGVar7 = (this->super_Solver).game;
        lVar10 = pGVar7->n_vertices;
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < lVar10);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  operator_delete__(pvVar5);
  operator_delete__(pvVar6);
  poVar8 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"solved with ",0xc);
  poVar8 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," iterations.",0xc);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (((this->super_Solver).trace != 0) &&
     (std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_Solver).logger,"Distractions:\n",0xe),
     0 < ((this->super_Solver).game)->n_vertices)) {
    uVar14 = 0;
    do {
      poVar8 = (this->super_Solver).logger;
      if (((this->distraction)._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
        lVar10 = 0xc;
        pcVar13 = "\x1b[1;38:5:34m";
      }
      else {
        lVar10 = 0xd;
        pcVar13 = "\x1b[1;38:5:124m";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar10);
      local_50.g = (this->super_Solver).game;
      local_50.v = (int)uVar14;
      poVar8 = operator<<(poVar8,&local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m",3);
      poVar8 = (this->super_Solver).logger;
      cVar2 = (char)poVar8;
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < ((this->super_Solver).game)->n_vertices);
  }
  return;
}

Assistant:

void
FPISolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */
    distraction.resize(nodecount());
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)
    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    int d = priority(nodecount()-1);
    int *p_start = new int[d+1];
    int *p_len = new int[d+1];
    parity.resize(nodecount());

    /**
     * Initialize p_start, p_len, parity
     */
    int v=0;
    for (int p=0; p<=d; p++) {
        if (priority(v) == p) {
            p_start[p] = v;
            while (v < nodecount() and priority(v) == p) {
                parity[v] = p&1;
                v++;
            }
            p_len[p] = v - p_start[p];
        } else {
            p_start[p] = -1;
            p_len[p] = 0;
        }
    }

    /**
     * The main loop
     */
    iterations = 1;
    int p = 0;
    while (p <= d) {
        if (p_len[p] == 0 or updateBlock(p_start[p], p_len[p]) == 0) {
            p++;
            continue;
        } 

        if (p != 0) {
            // actually we don't freeze at priority 0 :-)
            freezeThawReset(0, p_start[p] /* +p_len[p] */, p);
            p = 0;
        }

        iterations++;
#ifndef NDEBUG
        if (trace >= 2) logger << "restarting after finding distractions" << std::endl;
#endif
    }

    /**
     * Done, now tell Oink the solution
     */
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    /**
     * Free allocated data structures
     */
    delete[] strategy;
    delete[] frozen;
    delete[] p_start;
    delete[] p_len;

    logger << "solved with " << iterations << " iterations." << std::endl;

#ifndef NDEBUG
    if (trace) {
        logger << "Distractions:\n";
        for (int v=0; v<nodecount(); v++) {
            if (distraction[v]) logger << "\033[1;38:5:124m" << label_vertex(v) << "\033[m";
            else logger << "\033[1;38:5:34m" << label_vertex(v) << "\033[m";
            logger << std::endl;
        }
    }
#endif
}